

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skeleton_blocker_complex.cpp
# Opt level: O0

void __thiscall
test_skeleton_iterator_simplices::test_method(test_skeleton_iterator_simplices *this)

{
  undefined8 uVar1;
  bool bVar2;
  type_conflict1 tVar3;
  mapped_type *pmVar4;
  reference ppVar5;
  lazy_ostream *prev;
  ostream *poVar6;
  void *this_00;
  basic_cstring<const_char> local_490;
  basic_cstring<const_char> local_480;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_470;
  assertion_result local_450;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  reference local_418;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *local_3e8;
  reference *simplex;
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  __end2;
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  __begin2;
  iterator_range_base<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_348;
  iterator_range_base<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_boost::iterators::incrementable_traversal_tag>
  *local_2b8;
  Complex_simplex_around_vertex_range *__range2;
  Vertex_handle VStack_2a8;
  uint num_simplices_around;
  pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>
  pair;
  iterator __end1;
  iterator __begin1;
  map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
  *__range1;
  Vertex_handle local_280;
  Vertex_handle local_27c;
  Vertex_handle local_278;
  Vertex_handle local_274;
  undefined1 local_270 [8];
  map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
  expected_num_simplices;
  Vertex_handle local_238;
  Vertex_handle local_234;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  local_230;
  Edge_handle local_200;
  Vertex_handle local_1e8;
  Vertex_handle local_1e4;
  Edge_handle local_1e0;
  Vertex_handle local_1c8;
  Vertex_handle local_1c4;
  Edge_handle local_1c0;
  Vertex_handle local_1a8;
  Vertex_handle local_1a4;
  Edge_handle local_1a0;
  Vertex_handle local_188;
  Vertex_handle local_184;
  Edge_handle local_180;
  Vertex_handle local_168;
  Vertex_handle local_164;
  Edge_handle local_160;
  Vertex_handle local_148;
  Vertex_handle local_144;
  Edge_handle local_140;
  Vertex_handle local_128;
  Vertex_handle local_124;
  Edge_handle local_120;
  Vertex_handle local_108;
  Vertex_handle local_104;
  Edge_handle local_100;
  Vertex_handle local_e8;
  Vertex_handle local_e4;
  Edge_handle local_e0;
  Vertex_handle local_c8 [5];
  Vertex_handle local_b4;
  undefined1 local_b0 [8];
  Complex complex;
  test_skeleton_iterator_simplices *this_local;
  
  complex.blocker_map_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  Skeleton_blocker_complex
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,6,(Visitor *)0x0);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle(&local_b4,0)
  ;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle(local_c8,1);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_e0,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_b4,local_c8[0]);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle(&local_e4,1)
  ;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle(&local_e8,2)
  ;
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_100,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_e4,local_e8);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_104,2);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_108,0);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_120,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_104,local_108);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_124,1);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_128,3);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_140,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_124,local_128);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_144,2);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_148,3);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_160,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_144,local_148);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_164,2);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_168,5);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_180,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_164,local_168);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_184,3);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_188,5);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_1a0,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_184,local_188);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_1a4,2);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_1a8,4);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_1c0,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_1a4,local_1a8);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_1c4,4);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_1c8,5);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_1e0,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_1c4,local_1c8);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_1e4,3);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_1e8,4);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            (&local_200,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,local_1e4,local_1e8);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_234,2);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_238,3);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            ((Vertex_handle *)
             ((long)&expected_num_simplices._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),4)
  ;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            ((Vertex_handle *)
             &expected_num_simplices._M_t._M_impl.super__Rb_tree_header._M_node_count,5);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            (&local_230,local_234,local_238,
             expected_num_simplices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
             expected_num_simplices._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_blocker
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0,&local_230);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  ~Skeleton_blocker_simplex(&local_230);
  std::
  map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
  ::map((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
         *)local_270);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_274,0);
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)local_270,&local_274);
  *pmVar4 = 4;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_278,1);
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)local_270,&local_278);
  *pmVar4 = 6;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_27c,2);
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)local_270,&local_27c);
  *pmVar4 = 0xb;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_280,3);
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)local_270,&local_280);
  *pmVar4 = 9;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            ((Vertex_handle *)((long)&__range1 + 4),4);
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)local_270,(key_type *)((long)&__range1 + 4));
  *pmVar4 = 7;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            ((Vertex_handle *)&__range1,5);
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)local_270,(key_type *)&__range1);
  *pmVar4 = 7;
  __end1 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::begin((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                    *)local_270);
  pair = (pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>
          )std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::end((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                  *)local_270);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&pair);
    if (!bVar2) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>
             ::operator*(&__end1);
    _VStack_2a8 = *ppVar5;
    std::operator<<((ostream *)&std::clog,"found list: ");
    __range2._4_4_ = 0;
    Gudhi::skeleton_blocker::
    Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
    star_simplex_range((Complex_simplex_around_vertex_range *)&local_348,
                       (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                        *)local_b0,VStack_2a8);
    local_2b8 = &local_348;
    boost::iterator_range_detail::
    iterator_range_base<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_boost::iterators::incrementable_traversal_tag>
    ::begin((Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
             *)&__end2.nodes_to_be_seen.
                super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
                ._M_impl._M_node._M_size,local_2b8);
    boost::iterator_range_detail::
    iterator_range_base<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_boost::iterators::incrementable_traversal_tag>
    ::end((Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
           *)&simplex,local_2b8);
    while( true ) {
      tVar3 = boost::iterators::operator!=
                        ((iterator_facade<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_long>
                          *)&__end2.nodes_to_be_seen.
                             super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
                             ._M_impl._M_node._M_size,
                         (iterator_facade<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_long>
                          *)&simplex);
      if (!tVar3) break;
      boost::iterators::detail::
      iterator_facade_base<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_long,_false,_false>
      ::operator*(&local_418,
                  (iterator_facade_base<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_long,_false,_false>
                   *)&__end2.nodes_to_be_seen.
                      super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
                      ._M_impl._M_node._M_size);
      local_3e8 = &local_418;
      Gudhi::skeleton_blocker::
      Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::dimension(local_3e8);
      poVar6 = Gudhi::skeleton_blocker::operator<<((ostream *)&std::clog,local_3e8);
      std::operator<<(poVar6," - ");
      __range2._4_4_ = __range2._4_4_ + 1;
      Gudhi::skeleton_blocker::
      Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::~Skeleton_blocker_simplex(&local_418);
      boost::iterators::detail::
      iterator_facade_base<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_boost::iterators::forward_traversal_tag,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_long,_false,_false>
                    *)&__end2.nodes_to_be_seen.
                       super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
                       ._M_impl._M_node._M_size);
    }
    Gudhi::skeleton_blocker::
    Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
    ::~Simplex_around_vertex_iterator
              ((Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
                *)&simplex);
    Gudhi::skeleton_blocker::
    Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
    ::~Simplex_around_vertex_iterator
              ((Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
                *)&__end2.nodes_to_be_seen.
                   super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
                   ._M_impl._M_node._M_size);
    boost::
    iterator_range<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>_>
    ::~iterator_range((iterator_range<Gudhi::skeleton_blocker::Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>_>
                       *)&local_348);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
                 ,0x81);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_438);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_428,0xe1,&local_438);
      boost::test_tools::assertion_result::assertion_result
                (&local_450,__range2._4_4_ == num_simplices_around);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_480,"num_simplices_around == pair.second",0x23);
      boost::unit_test::operator<<(&local_470,prev,&local_480);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_490,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
                 ,0x81);
      boost::test_tools::tt_detail::report_assertion(&local_450,&local_470,&local_490,0xe1,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_470);
      boost::test_tools::assertion_result::~assertion_result(&local_450);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    poVar6 = (ostream *)std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"current vertex:");
    poVar6 = Gudhi::skeleton_blocker::operator<<(poVar6,&stack0xfffffffffffffd58);
    std::operator<<(poVar6," - ");
    poVar6 = std::operator<<((ostream *)&std::clog,"expected_num_simplices:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,num_simplices_around);
    std::operator<<(poVar6," - ");
    poVar6 = std::operator<<((ostream *)&std::clog,"found:");
    this_00 = (void *)std::ostream::operator<<(poVar6,__range2._4_4_);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>
    ::operator++(&__end1);
  }
  std::
  map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
  ::~map((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
          *)local_270);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  ~Skeleton_blocker_complex
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             local_b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_skeleton_iterator_simplices) {
  Complex complex(6);
  complex.add_edge_without_blockers(Vertex_handle(0), Vertex_handle(1));
  complex.add_edge_without_blockers(Vertex_handle(1), Vertex_handle(2));
  complex.add_edge_without_blockers(Vertex_handle(2), Vertex_handle(0));
  complex.add_edge_without_blockers(Vertex_handle(1), Vertex_handle(3));
  complex.add_edge_without_blockers(Vertex_handle(2), Vertex_handle(3));
  complex.add_edge_without_blockers(Vertex_handle(2), Vertex_handle(5));
  complex.add_edge_without_blockers(Vertex_handle(3), Vertex_handle(5));
  complex.add_edge_without_blockers(Vertex_handle(2), Vertex_handle(4));
  complex.add_edge_without_blockers(Vertex_handle(4), Vertex_handle(5));
  complex.add_edge_without_blockers(Vertex_handle(3), Vertex_handle(4));

  complex.add_blocker(Simplex(Vertex_handle(2), Vertex_handle(3), Vertex_handle(4), Vertex_handle(5)));

  std::map<Vertex_handle, unsigned> expected_num_simplices;

  expected_num_simplices[Vertex_handle(0)] = 4;
  expected_num_simplices[Vertex_handle(1)] = 6;
  expected_num_simplices[Vertex_handle(2)] = 11;
  expected_num_simplices[Vertex_handle(3)] = 9;
  expected_num_simplices[Vertex_handle(4)] = 7;
  expected_num_simplices[Vertex_handle(5)] = 7;

  for (auto pair : expected_num_simplices) {
    std::clog << "found list: ";
    unsigned num_simplices_around = 0;
    for (const auto& simplex : complex.star_simplex_range(pair.first)) {
      simplex.dimension();
      std::clog << simplex << " - ";
      ++num_simplices_around;
    }

    BOOST_CHECK(num_simplices_around == pair.second);

    std::clog << std::endl << "current vertex:" << pair.first << " - ";
    std::clog << "expected_num_simplices:" << pair.second << " - ";
    std::clog << "found:" << num_simplices_around << std::endl;
  }
}